

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O2

TA_RetCode TA_GroupTableAlloc(TA_StringTable **table)

{
  TA_RetCode TVar1;
  TA_StringTable *pTVar2;
  
  if (table != (TA_StringTable **)0x0) {
    pTVar2 = (TA_StringTable *)calloc(1,0x1c);
    TVar1 = TA_SUCCESS;
    if (pTVar2 == (TA_StringTable *)0x0) {
      TVar1 = TA_ALLOC_ERR;
      pTVar2 = (TA_StringTable *)0x0;
    }
    else {
      pTVar2[1].size = 0xa20bb20b;
      pTVar2->size = 10;
      pTVar2->string = TA_GroupString;
      pTVar2->hiddenData = pTVar2 + 1;
    }
    *table = pTVar2;
    return TVar1;
  }
  return TA_BAD_PARAM;
}

Assistant:

TA_RetCode TA_GroupTableAlloc( TA_StringTable **table )
{
   TA_StringTable *stringTable;
   TA_StringTablePriv *stringTablePriv;

   if( table == NULL )
   {
      return TA_BAD_PARAM;
   }

   stringTable = (TA_StringTable *)TA_Malloc( sizeof(TA_StringTable) + sizeof(TA_StringTablePriv) );
   if( !stringTable )
   {
      *table = NULL;
      return TA_ALLOC_ERR;
   }

   memset( stringTable, 0, sizeof(TA_StringTable) + sizeof(TA_StringTablePriv) );
   stringTablePriv = (TA_StringTablePriv *)(((char *)stringTable)+sizeof(TA_StringTable));
   stringTablePriv->magicNumber = TA_STRING_TABLE_GROUP_MAGIC_NB;

   stringTable->size = TA_NB_GROUP_ID;
   stringTable->string = &TA_GroupString[0];
   stringTable->hiddenData = stringTablePriv;

   /* From this point, TA_FuncTableFree can be safely called. */

   /* Success. Return the table to the caller. */
   *table = stringTable;

   return TA_SUCCESS;
}